

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O0

int __thiscall
SkylineBinPack::ComputeWastedArea
          (SkylineBinPack *this,int skylineNodeIndex,int width,int height,int y)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int a;
  uint uVar4;
  int iVar5;
  SkylineNode *pSVar6;
  int rightSide;
  int leftSide;
  int rectRight;
  int rectLeft;
  int wastedArea;
  int y_local;
  int height_local;
  int width_local;
  int skylineNodeIndex_local;
  SkylineBinPack *this_local;
  
  rectRight = 0;
  pSVar6 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                     (&this->skyLine,(long)skylineNodeIndex);
  iVar1 = pSVar6->x;
  a = iVar1 + width;
  height_local = skylineNodeIndex;
  while( true ) {
    uVar4 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Size(&this->skyLine);
    bVar3 = false;
    if (height_local < (int)uVar4) {
      pSVar6 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                         (&this->skyLine,(long)height_local);
      bVar3 = pSVar6->x < a;
    }
    if ((!bVar3) ||
       (pSVar6 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                           (&this->skyLine,(long)height_local), a <= pSVar6->x)) {
      return rectRight;
    }
    pSVar6 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(long)height_local);
    iVar2 = pSVar6->x;
    pSVar6 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(long)height_local);
    if (iVar2 + pSVar6->width <= iVar1) {
      return rectRight;
    }
    pSVar6 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(long)height_local);
    iVar2 = pSVar6->x;
    pSVar6 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(long)height_local);
    iVar5 = MIN<int>(a,iVar2 + pSVar6->width);
    pSVar6 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(long)height_local);
    if (y < pSVar6->y) break;
    pSVar6 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(long)height_local);
    rectRight = (iVar5 - iVar2) * (y - pSVar6->y) + rectRight;
    height_local = height_local + 1;
  }
  __assert_fail("y >= skyLine[skylineNodeIndex].y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                ,0xa2,"int SkylineBinPack::ComputeWastedArea(int, int, int, int) const");
}

Assistant:

int SkylineBinPack::ComputeWastedArea(int skylineNodeIndex, int width, int height, int y) const
{
	int wastedArea = 0;
	const int rectLeft = skyLine[skylineNodeIndex].x;
	const int rectRight = rectLeft + width;
	for(; skylineNodeIndex < (int)skyLine.Size() && skyLine[skylineNodeIndex].x < rectRight; ++skylineNodeIndex)
	{
		if (skyLine[skylineNodeIndex].x >= rectRight || skyLine[skylineNodeIndex].x + skyLine[skylineNodeIndex].width <= rectLeft)
			break;

		int leftSide = skyLine[skylineNodeIndex].x;
		int rightSide = MIN(rectRight, leftSide + skyLine[skylineNodeIndex].width);
		assert(y >= skyLine[skylineNodeIndex].y);
		wastedArea += (rightSide - leftSide) * (y - skyLine[skylineNodeIndex].y);
	}
	return wastedArea;
}